

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

TFad<6,_double> * __thiscall
TPZTensor<TFad<6,_double>_>::Det
          (TFad<6,_double> *__return_storage_ptr__,TPZTensor<TFad<6,_double>_> *this)

{
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_f8;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_e8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_d8;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_c8;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_b8;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_a8;
  TFad<6,_double> *local_98;
  TFad<6,_double> *local_90;
  TFad<6,_double> **local_88;
  TFad<6,_double> *local_80;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>
  local_78;
  TFad<6,_double> *local_68;
  TFad<6,_double> *local_60;
  TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  local_58;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>
  local_48;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_38;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_28;
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadCst<double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>_>_>
  local_18;
  
  local_e8.fadexpr_.left_ = &local_f8;
  local_e8.fadexpr_.right_ = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_b8.fadexpr_.right_ = local_e8.fadexpr_.right_ + 3;
  local_58.fadexpr_.left_ = (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)&local_68
  ;
  local_c8.fadexpr_.right_ = local_e8.fadexpr_.right_ + 5;
  local_48.fadexpr_.left_ = &local_58;
  local_d8.fadexpr_.left_ = local_e8.fadexpr_.right_ + 1;
  local_b8.fadexpr_.left_ = local_e8.fadexpr_.right_ + 2;
  local_88 = &local_98;
  local_f8.fadexpr_.left_ = local_e8.fadexpr_.right_ + 4;
  local_78.fadexpr_.left_ =
       (TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
        *)&local_88;
  local_48.fadexpr_.right_ = &local_78;
  local_78.fadexpr_.right_.constant_ = 2.0;
  local_38.fadexpr_.left_ = &local_48;
  local_a8.fadexpr_.left_ = &local_b8;
  local_38.fadexpr_.right_ = &local_a8;
  local_28.fadexpr_.left_ = &local_38;
  local_c8.fadexpr_.left_ = &local_d8;
  local_28.fadexpr_.right_ = &local_c8;
  local_18.fadexpr_.left_ = &local_28;
  local_18.fadexpr_.right_ = &local_e8;
  local_f8.fadexpr_.right_ = local_f8.fadexpr_.left_;
  local_d8.fadexpr_.right_ = local_d8.fadexpr_.left_;
  local_a8.fadexpr_.right_ = local_b8.fadexpr_.left_;
  local_98 = local_d8.fadexpr_.left_;
  local_90 = local_b8.fadexpr_.left_;
  local_80 = local_f8.fadexpr_.left_;
  local_68 = local_e8.fadexpr_.right_;
  local_60 = local_b8.fadexpr_.right_;
  local_58.fadexpr_.right_ = local_c8.fadexpr_.right_;
  TFad<6,double>::
  TFad<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>,TFadCst<double>>>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>>>
            ((TFad<6,double> *)__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

T TPZTensor<T>::Det() const {
    return fData[_XX_] * fData[_YY_] * fData[_ZZ_] + fData[_XY_] * fData[_XZ_] * fData[_YZ_]*2. - fData[_XZ_] * fData[_YY_] * fData[_XZ_] -
            fData[_XY_] * fData[_XY_] * fData[_ZZ_] - fData[_YZ_] * fData[_YZ_] * fData[_XX_];
}